

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  _Base_ptr p_Var2;
  LogMessage *pLVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  LogFinisher local_141;
  LogMessage local_140;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  p_Var5 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var5->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < number]) {
    if (number <= (int)p_Var4[1]._M_color) {
      p_Var2 = p_Var4;
    }
  }
  p_Var4 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var5) && (p_Var4 = p_Var2, number < (int)p_Var2[1]._M_color))
  {
    p_Var4 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var5) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x221);
    pLVar3 = LogMessage::operator<<(&local_98,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_140,pLVar3);
    LogMessage::~LogMessage(&local_98);
  }
  if (*(char *)((long)&p_Var4[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x222);
    pLVar3 = LogMessage::operator<<
                       (&local_d0,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_140,pLVar3);
    LogMessage::~LogMessage(&local_d0);
  }
  bVar1 = *(byte *)&p_Var4[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar3 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_140,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
    LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x222);
    pLVar3 = LogMessage::operator<<
                       (&local_108,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_140,pLVar3);
    LogMessage::~LogMessage(&local_108);
  }
  p_Var4 = p_Var4[1]._M_parent;
  if (*(int *)&p_Var4->_M_parent <= index) {
    LogMessage::LogMessage
              (&local_140,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x340);
    pLVar3 = LogMessage::operator<<(&local_140,"CHECK failed: (index) < (size()): ");
    LogFinisher::operator=(&local_141,pLVar3);
    LogMessage::~LogMessage(&local_140);
  }
  return *(MessageLite **)(*(long *)p_Var4 + (long)index * 8);
}

Assistant:

MessageLite* ExtensionSet::MutableRepeatedMessage(int number, int index) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, MESSAGE);
  return iter->second.repeated_message_value->Mutable(index);
}